

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool libcellml::hasUnitsImports(UnitsPtr *units)

{
  string *__return_storage_ptr__;
  bool bVar1;
  size_t sVar2;
  ulong index;
  ModelPtr model;
  string reference;
  ParentedEntityConstPtr local_70;
  undefined1 local_60 [16];
  string local_50;
  
  bVar1 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
             (local_60 + 0x10),
             &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  owningModel(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  sVar2 = Units::unitCount((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
  index = 0;
  __return_storage_ptr__ = (string *)(local_60 + 0x10);
  do {
    if ((bVar1 != false) || (sVar2 <= index)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.
                  super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return bVar1;
    }
    Units::unitAttributeReference_abi_cxx11_
              (__return_storage_ptr__,
               (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               index);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001f634d:
      bVar1 = false;
    }
    else {
      bVar1 = isStandardUnitName(__return_storage_ptr__);
      if (bVar1) goto LAB_001f634d;
      bVar1 = Model::hasUnits((Model *)local_70.
                                       super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,__return_storage_ptr__);
      if (!bVar1) goto LAB_001f634d;
      Model::units((Model *)local_60,
                   (string *)
                   local_70.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      bVar1 = hasUnitsImports((UnitsPtr *)local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    index = index + 1;
  } while( true );
}

Assistant:

bool hasUnitsImports(const UnitsPtr &units)
{
    bool importPresent = units->isImport();
    auto model = owningModel(units);
    size_t unistCount = units->unitCount();
    for (size_t index = 0; !importPresent && (index < unistCount); ++index) {
        std::string reference = units->unitAttributeReference(index);
        if (!reference.empty() && !isStandardUnitName(reference)) {
            if (model->hasUnits(reference)) {
                importPresent = hasUnitsImports(model->units(reference));
            }
        }
    }
    return importPresent;
}